

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::GetLinkDependencyFile
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmGlobalNinjaGenerator *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  string *local_28;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalNinjaGenerator *this_local;
  
  local_28 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_48,target);
  pcVar1 = GetGlobalNinjaGenerator(this);
  (*(pcVar1->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            (&local_68,pcVar1,local_28);
  cmStrCat<std::__cxx11::string,std::__cxx11::string,char_const(&)[8]>
            (__return_storage_ptr__,&local_48,&local_68,(char (*) [8])"/link.d");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::GetLinkDependencyFile(
  cmGeneratorTarget* target, std::string const& config) const
{
  return cmStrCat(target->GetSupportDirectory(),
                  this->GetGlobalNinjaGenerator()->ConfigDirectory(config),
                  "/link.d");
}